

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O1

FT_Error cid_read_subrs(CID_Face face)

{
  uint uVar1;
  int iVar2;
  FT_Memory memory;
  FT_Stream stream;
  void *pvVar3;
  CID_FaceDict pCVar4;
  undefined8 *puVar5;
  uint uVar6;
  CID_Subrs pCVar7;
  uchar *puVar8;
  FT_Byte **ppFVar9;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  FT_ULong count;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  bool bVar19;
  long *local_48;
  uint local_34 [2];
  FT_Error error;
  
  memory = (face->root).memory;
  stream = face->cid_stream;
  pvVar3 = face->psaux;
  local_48 = (long *)0x0;
  pCVar7 = (CID_Subrs)
           ft_mem_realloc(memory,0x10,0,(long)(face->cid).num_dicts,(void *)0x0,(FT_Error *)local_34
                         );
  face->subrs = pCVar7;
  if (local_34[0] == 0) {
    uVar12 = 0;
    if ((face->cid).num_dicts < 1) {
      local_48 = (long *)0x0;
    }
    else {
      lVar14 = 0;
      local_48 = (long *)0x0;
      do {
        pCVar4 = (face->cid).font_dicts;
        uVar1 = pCVar4[lVar14].num_subrs;
        if ((ulong)uVar1 == 0) {
          uVar17 = 5;
          uVar6 = uVar1;
        }
        else {
          iVar2 = pCVar4[lVar14].private_dict.lenIV;
          uVar13 = uVar1 + 1;
          uVar10 = (ulong)uVar13;
          if (uVar12 < uVar13) {
            uVar17 = (uVar1 & 0xfffffffc) + 4;
            if (uVar12 < uVar17) {
              local_48 = (long *)ft_mem_realloc(memory,8,(ulong)uVar12,(ulong)uVar17,local_48,
                                                (FT_Error *)local_34);
              bVar19 = local_34[0] == 0;
              uVar6 = (uint)CONCAT71((int7)((ulong)local_48 >> 8),bVar19);
              if (bVar19) {
                uVar12 = uVar17;
              }
              uVar17 = local_34[0];
              if (!bVar19) {
                uVar17 = 6;
              }
            }
            else {
              local_34[0] = 0xa0;
              uVar6 = 0;
              uVar17 = 6;
            }
            if ((char)uVar6 == '\0') goto LAB_0020271c;
          }
          local_34[0] = FT_Stream_Seek(stream,pCVar4[lVar14].subrmap_offset +
                                              (face->cid).data_offset);
          uVar17 = 6;
          uVar6 = local_34[0];
          if (local_34[0] == 0) {
            local_34[0] = FT_Stream_EnterFrame(stream,(ulong)(pCVar4[lVar14].sd_bytes * uVar13));
            ppFVar9 = (FT_Byte **)(ulong)local_34[0];
            if (local_34[0] == 0) {
              puVar8 = stream->cursor;
              uVar17 = pCVar4[lVar14].sd_bytes;
              uVar15 = 0;
              do {
                cVar11 = (char)uVar17;
                if (cVar11 == '\0') {
                  uVar16 = 0;
                }
                else {
                  lVar18 = 0;
                  uVar16 = 0;
                  do {
                    uVar16 = uVar16 << 8 | (ulong)puVar8[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (cVar11 != (char)lVar18);
                }
                local_48[uVar15] = uVar16;
                uVar15 = uVar15 + 1;
                puVar8 = puVar8 + (uVar17 & 0xff);
              } while (uVar15 != uVar1 + 1 + (uint)(uVar13 == 0));
              FT_Stream_ExitFrame(stream);
              ppFVar9 = (FT_Byte **)&DAT_00000001;
              do {
                if ((ulong)local_48[(long)ppFVar9] < (ulong)local_48[(int)ppFVar9 - 1])
                goto LAB_0020270c;
                uVar17 = (int)ppFVar9 + 1;
                ppFVar9 = (FT_Byte **)(ulong)uVar17;
              } while (uVar17 <= uVar1);
              ppFVar9 = (FT_Byte **)(stream->size - (face->cid).data_offset);
              if (ppFVar9 < (FT_Byte **)local_48[uVar1]) {
LAB_0020270c:
                local_34[0] = 3;
              }
              else {
                count = local_48[uVar1] - *local_48;
                ppFVar9 = (FT_Byte **)
                          ft_mem_realloc(memory,8,0,uVar10,(void *)0x0,(FT_Error *)local_34);
                pCVar7->code = ppFVar9;
                if (local_34[0] == 0) {
                  ppFVar9 = (FT_Byte **)ft_mem_alloc(memory,count,(FT_Error *)local_34);
                  *pCVar7->code = (FT_Byte *)ppFVar9;
                  if (local_34[0] == 0) {
                    local_34[0] = FT_Stream_Seek(stream,*local_48 + (face->cid).data_offset);
                    ppFVar9 = (FT_Byte **)(ulong)local_34[0];
                    if (local_34[0] == 0) {
                      local_34[0] = FT_Stream_Read(stream,*pCVar7->code,count);
                      ppFVar9 = (FT_Byte **)(ulong)local_34[0];
                      if (local_34[0] == 0) {
                        if (uVar13 < 3) {
                          uVar10 = 2;
                        }
                        uVar15 = 1;
                        do {
                          pCVar7->code[uVar15] =
                               pCVar7->code[uVar15 - 1] + (local_48[uVar15] - local_48[uVar15 - 1]);
                          uVar15 = uVar15 + 1;
                        } while (uVar10 != uVar15);
                        if (-1 < iVar2) {
                          uVar10 = 0;
                          do {
                            uVar15 = uVar10 + 1;
                            (**(code **)((long)pvVar3 + 0x20))
                                      (pCVar7->code[uVar10],local_48[uVar10 + 1] - local_48[uVar10],
                                       0x10ea);
                            uVar10 = uVar15;
                          } while (uVar1 + (uVar1 == 0) != uVar15);
                        }
                        pCVar7->num_subrs = uVar1;
                        uVar17 = 0;
                        uVar6 = uVar1;
                        goto LAB_0020271c;
                      }
                    }
                  }
                }
              }
            }
            uVar17 = 6;
            uVar6 = (uint)ppFVar9;
          }
        }
LAB_0020271c:
        if ((uVar17 != 0) && (uVar17 != 5)) {
          if (uVar17 != 6) {
            return uVar6;
          }
          if (face->subrs != (CID_Subrs)0x0) {
            if (0 < (face->cid).num_dicts) {
              lVar14 = 8;
              lVar18 = 0;
              do {
                puVar5 = *(undefined8 **)((long)&face->subrs->num_subrs + lVar14);
                if (puVar5 != (undefined8 *)0x0) {
                  ft_mem_free(memory,(void *)*puVar5);
                  **(undefined8 **)((long)&face->subrs->num_subrs + lVar14) = 0;
                }
                ft_mem_free(memory,*(void **)((long)&face->subrs->num_subrs + lVar14));
                *(undefined8 *)((long)&face->subrs->num_subrs + lVar14) = 0;
                lVar18 = lVar18 + 1;
                lVar14 = lVar14 + 0x10;
              } while (lVar18 < (face->cid).num_dicts);
            }
            ft_mem_free(memory,face->subrs);
            face->subrs = (CID_Subrs)0x0;
          }
          break;
        }
        lVar14 = lVar14 + 1;
        pCVar7 = pCVar7 + 1;
      } while (lVar14 < (face->cid).num_dicts);
    }
  }
  ft_mem_free(memory,local_48);
  return local_34[0];
}

Assistant:

static FT_Error
  cid_read_subrs( CID_Face  face )
  {
    CID_FaceInfo   cid    = &face->cid;
    FT_Memory      memory = face->root.memory;
    FT_Stream      stream = face->cid_stream;
    FT_Error       error;
    FT_Int         n;
    CID_Subrs      subr;
    FT_UInt        max_offsets = 0;
    FT_ULong*      offsets = NULL;
    PSAux_Service  psaux = (PSAux_Service)face->psaux;


    if ( FT_NEW_ARRAY( face->subrs, cid->num_dicts ) )
      goto Exit;

    subr = face->subrs;
    for ( n = 0; n < cid->num_dicts; n++, subr++ )
    {
      CID_FaceDict  dict  = cid->font_dicts + n;
      FT_Int        lenIV = dict->private_dict.lenIV;
      FT_UInt       count, num_subrs = dict->num_subrs;
      FT_ULong      data_len;
      FT_Byte*      p;


      if ( !num_subrs )
        continue;

      /* reallocate offsets array if needed */
      if ( num_subrs + 1 > max_offsets )
      {
        FT_UInt  new_max = FT_PAD_CEIL( num_subrs + 1, 4 );


        if ( new_max <= max_offsets )
        {
          error = FT_THROW( Syntax_Error );
          goto Fail;
        }

        if ( FT_RENEW_ARRAY( offsets, max_offsets, new_max ) )
          goto Fail;

        max_offsets = new_max;
      }

      /* read the subrmap's offsets */
      if ( FT_STREAM_SEEK( cid->data_offset + dict->subrmap_offset )     ||
           FT_FRAME_ENTER( ( num_subrs + 1 ) * (FT_UInt)dict->sd_bytes ) )
        goto Fail;

      p = (FT_Byte*)stream->cursor;
      for ( count = 0; count <= num_subrs; count++ )
        offsets[count] = cid_get_offset( &p, (FT_Byte)dict->sd_bytes );

      FT_FRAME_EXIT();

      /* offsets must be ordered */
      for ( count = 1; count <= num_subrs; count++ )
        if ( offsets[count - 1] > offsets[count] )
        {
          FT_ERROR(( "cid_read_subrs: offsets are not ordered\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

      if ( offsets[num_subrs] > stream->size - cid->data_offset )
      {
        FT_ERROR(( "cid_read_subrs: too large `subrs' offsets\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* now, compute the size of subrs charstrings, */
      /* allocate, and read them                     */
      data_len = offsets[num_subrs] - offsets[0];

      if ( FT_NEW_ARRAY( subr->code, num_subrs + 1 ) ||
           FT_ALLOC( subr->code[0], data_len )       )
        goto Fail;

      if ( FT_STREAM_SEEK( cid->data_offset + offsets[0] ) ||
           FT_STREAM_READ( subr->code[0], data_len )  )
        goto Fail;

      /* set up pointers */
      for ( count = 1; count <= num_subrs; count++ )
      {
        FT_ULong  len;


        len               = offsets[count] - offsets[count - 1];
        subr->code[count] = subr->code[count - 1] + len;
      }

      /* decrypt subroutines, but only if lenIV >= 0 */
      if ( lenIV >= 0 )
      {
        for ( count = 0; count < num_subrs; count++ )
        {
          FT_ULong  len;


          len = offsets[count + 1] - offsets[count];
          psaux->t1_decrypt( subr->code[count], len, 4330 );
        }
      }

      subr->num_subrs = (FT_Int)num_subrs;
    }

  Exit:
    FT_FREE( offsets );
    return error;

  Fail:
    if ( face->subrs )
    {
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        if ( face->subrs[n].code )
          FT_FREE( face->subrs[n].code[0] );

        FT_FREE( face->subrs[n].code );
      }
      FT_FREE( face->subrs );
    }
    goto Exit;
  }